

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_option(spng_ctx *ctx,spng_option option,int value)

{
  int value_local;
  spng_option option_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else if (ctx->state == SPNG_STATE_INVALID) {
    ctx_local._4_4_ = 0x46;
  }
  else {
    switch(option) {
    case SPNG_KEEP_UNKNOWN_CHUNKS:
      *(ushort *)&ctx->field_0xcc = *(ushort *)&ctx->field_0xcc & 0xfeff | (ushort)(value != 0) << 8
      ;
      break;
    case SPNG_IMG_COMPRESSION_LEVEL:
      (ctx->image_options).compression_level = value;
      break;
    case SPNG_IMG_WINDOW_BITS:
      (ctx->image_options).window_bits = value;
      break;
    case SPNG_IMG_MEM_LEVEL:
      (ctx->image_options).mem_level = value;
      break;
    case SPNG_IMG_COMPRESSION_STRATEGY:
      (ctx->image_options).strategy = value;
      break;
    case SPNG_TEXT_COMPRESSION_LEVEL:
      (ctx->text_options).compression_level = value;
      break;
    case SPNG_TEXT_WINDOW_BITS:
      (ctx->text_options).window_bits = value;
      break;
    case SPNG_TEXT_MEM_LEVEL:
      (ctx->text_options).mem_level = value;
      break;
    case SPNG_TEXT_COMPRESSION_STRATEGY:
      (ctx->text_options).strategy = value;
      break;
    case SPNG_FILTER_CHOICE:
      if ((value & 0xffffff07U) != 0) {
        return 1;
      }
      (ctx->encode_flags).filter_choice = value;
      break;
    case SPNG_CHUNK_COUNT_LIMIT:
      if (value < 0) {
        return 1;
      }
      if ((int)ctx->chunk_count_total < value) {
        return 1;
      }
      ctx->chunk_count_limit = value;
      break;
    case SPNG_ENCODE_TO_BUFFER:
      if (value < 0) {
        return 1;
      }
      if ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0) {
        return 0x51;
      }
      if (SPNG_STATE_INIT < ctx->state) {
        return 0x54;
      }
      if (value != 0) {
        *(ushort *)&ctx->field_0xcc = *(ushort *)&ctx->field_0xcc & 0xfffd | 2;
        ctx->state = SPNG_STATE_INPUT;
      }
      break;
    default:
      return 1;
    }
    if (option < 0x20) {
      ctx->optimize_option = (1 << ((byte)option & 0x1f) ^ 0xffffffffU) & ctx->optimize_option;
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_option(spng_ctx *ctx, enum spng_option option, int value)
{
    if(ctx == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;

    switch(option)
    {
        case SPNG_KEEP_UNKNOWN_CHUNKS:
        {
            ctx->keep_unknown = value ? 1 : 0;
            break;
        }
        case SPNG_IMG_COMPRESSION_LEVEL:
        {
            ctx->image_options.compression_level = value;
            break;
        }
        case SPNG_IMG_WINDOW_BITS:
        {
            ctx->image_options.window_bits = value;
            break;
        }
        case SPNG_IMG_MEM_LEVEL:
        {
            ctx->image_options.mem_level = value;
            break;
        }
        case SPNG_IMG_COMPRESSION_STRATEGY:
        {
            ctx->image_options.strategy = value;
            break;
        }
        case SPNG_TEXT_COMPRESSION_LEVEL:
        {
            ctx->text_options.compression_level = value;
            break;
        }
        case SPNG_TEXT_WINDOW_BITS:
        {
            ctx->text_options.window_bits = value;
            break;
        }
        case SPNG_TEXT_MEM_LEVEL:
        {
            ctx->text_options.mem_level = value;
            break;
        }
        case SPNG_TEXT_COMPRESSION_STRATEGY:
        {
            ctx->text_options.strategy = value;
            break;
        }
        case SPNG_FILTER_CHOICE:
        {
            if(value & ~SPNG_FILTER_CHOICE_ALL) return 1;
            ctx->encode_flags.filter_choice = value;
            break;
        }
        case SPNG_CHUNK_COUNT_LIMIT:
        {
            if(value < 0) return 1;
            if(value > (int)ctx->chunk_count_total) return 1;
            ctx->chunk_count_limit = value;
            break;
        }
        case SPNG_ENCODE_TO_BUFFER:
        {
            if(value < 0) return 1;
            if(!ctx->encode_only) return SPNG_ECTXTYPE;
            if(ctx->state >= SPNG_STATE_OUTPUT) return SPNG_EOPSTATE;

            if(!value) break;

            ctx->internal_buffer = 1;
            ctx->state = SPNG_STATE_OUTPUT;

            break;
        }
        default: return 1;
    }

    /* Option can no longer be overriden by the library */
    if(option < 32) ctx->optimize_option &= ~(1 << option);

    return 0;
}